

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cilk_fiber-unix.cpp
# Opt level: O0

void __thiscall cilk_fiber_sysdep::cilk_fiber_sysdep(cilk_fiber_sysdep *this,size_t stack_size)

{
  cilk_fiber_sysdep *in_RSI;
  long in_RDI;
  uintptr_t align_mask;
  size_t in_stack_ffffffffffffffe8;
  
  cilk_fiber::cilk_fiber(&this->super_cilk_fiber,stack_size);
  *(undefined4 *)(in_RDI + 0x90) = 0x5afef00d;
  make_stack(in_RSI,in_stack_ffffffffffffffe8);
  *(ulong *)(in_RDI + 0x58) = *(long *)(in_RDI + 0x58) - (*(ulong *)(in_RDI + 0x58) & 0x1f);
  return;
}

Assistant:

cilk_fiber_sysdep::cilk_fiber_sysdep(std::size_t stack_size)
    : cilk_fiber(stack_size)
    , m_magic(magic_number)
{
    // Set m_stack and m_stack_base.
    make_stack(stack_size);

    // Get high-address of stack, with 32-bytes of spare space, and rounded
    // down to the nearest 32-byte boundary.
    const uintptr_t align_mask = 32 - 1;
    m_stack_base -= ((std::size_t) m_stack_base) & align_mask;
}